

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_astDownCastNode_create
          (sysbvm_context_t *context,sysbvm_tuple_t sourcePosition,sysbvm_tuple_t typeExpression,
          sysbvm_tuple_t valueExpression)

{
  sysbvm_object_tuple_t *psVar1;
  
  psVar1 = sysbvm_context_allocatePointerTuple(context,(context->roots).astDownCastNodeType,6);
  (psVar1->field_1).pointers[0] = sourcePosition;
  psVar1[1].field_1.pointers[0] = typeExpression;
  psVar1[2].header.field_0.typePointer = valueExpression;
  psVar1[2].header.identityHashAndFlags = 0xf;
  psVar1[2].header.objectSize = 0;
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_astDownCastNode_create(sysbvm_context_t *context, sysbvm_tuple_t sourcePosition, sysbvm_tuple_t typeExpression, sysbvm_tuple_t valueExpression)
{
    sysbvm_astDownCastNode_t *result = (sysbvm_astDownCastNode_t*)sysbvm_context_allocatePointerTuple(context, context->roots.astDownCastNodeType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_astDownCastNode_t));
    result->super.sourcePosition = sourcePosition;
    result->typeExpression = typeExpression;
    result->valueExpression = valueExpression;
    result->isUnchecked = SYSBVM_FALSE_TUPLE;
    return (sysbvm_tuple_t)result;
}